

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int iso9660_free(archive_write *a)

{
  int iVar1;
  long in_RDI;
  int ret;
  int i;
  iso9660_conflict *iso9660;
  int local_14;
  iso9660_conflict *iso9660_00;
  
  iso9660_00 = *(iso9660_conflict **)(in_RDI + 0xd0);
  if (-1 < iso9660_00->temp_fd) {
    close(iso9660_00->temp_fd);
  }
  iVar1 = zisofs_free((archive_write *)iso9660_00);
  isoent_free_all((isoent *)iso9660_00);
  for (local_14 = 0; local_14 < (iso9660_00->primary).max_depth; local_14 = local_14 + 1) {
    free((&((archive_write_filter *)(iso9660_00->primary).pathtbl)->next_filter)[(long)local_14 * 4]
        );
  }
  free((archive_write_filter *)(iso9660_00->primary).pathtbl);
  if (((uint)iso9660_00->opt >> 0x11 & 3) != 0) {
    isoent_free_all((isoent *)iso9660_00);
    for (local_14 = 0; local_14 < (iso9660_00->joliet).max_depth; local_14 = local_14 + 1) {
      free((iso9660_00->joliet).pathtbl[local_14].sorted);
    }
    free((iso9660_00->joliet).pathtbl);
  }
  isofile_free_all_entries(iso9660_00);
  isofile_free_hardlinks(iso9660_00);
  archive_string_free((archive_string *)0x18e059);
  archive_string_free((archive_string *)0x18e06a);
  archive_string_free((archive_string *)0x18e07b);
  archive_string_free((archive_string *)0x18e08c);
  archive_string_free((archive_string *)0x18e09d);
  archive_string_free((archive_string *)0x18e0ae);
  archive_string_free((archive_string *)0x18e0bf);
  archive_string_free((archive_string *)0x18e0d0);
  archive_string_free((archive_string *)0x18e0e1);
  archive_string_free((archive_string *)0x18e0f6);
  archive_string_free((archive_string *)0x18e10b);
  archive_string_free((archive_string *)0x18e119);
  archive_string_free((archive_string *)0x18e127);
  free(iso9660_00);
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  return iVar1;
}

Assistant:

static int
iso9660_free(struct archive_write *a)
{
	struct iso9660 *iso9660;
	int i, ret;

	iso9660 = a->format_data;

	/* Close the temporary file. */
	if (iso9660->temp_fd >= 0)
		close(iso9660->temp_fd);

	/* Free some stuff for zisofs operations. */
	ret = zisofs_free(a);

	/* Remove directory entries in tree which includes file entries. */
	isoent_free_all(iso9660->primary.rootent);
	for (i = 0; i < iso9660->primary.max_depth; i++)
		free(iso9660->primary.pathtbl[i].sorted);
	free(iso9660->primary.pathtbl);

	if (iso9660->opt.joliet) {
		isoent_free_all(iso9660->joliet.rootent);
		for (i = 0; i < iso9660->joliet.max_depth; i++)
			free(iso9660->joliet.pathtbl[i].sorted);
		free(iso9660->joliet.pathtbl);
	}

	/* Remove isofile entries. */
	isofile_free_all_entries(iso9660);
	isofile_free_hardlinks(iso9660);

	archive_string_free(&(iso9660->cur_dirstr));
	archive_string_free(&(iso9660->volume_identifier));
	archive_string_free(&(iso9660->publisher_identifier));
	archive_string_free(&(iso9660->data_preparer_identifier));
	archive_string_free(&(iso9660->application_identifier));
	archive_string_free(&(iso9660->copyright_file_identifier));
	archive_string_free(&(iso9660->abstract_file_identifier));
	archive_string_free(&(iso9660->bibliographic_file_identifier));
	archive_string_free(&(iso9660->el_torito.catalog_filename));
	archive_string_free(&(iso9660->el_torito.boot_filename));
	archive_string_free(&(iso9660->el_torito.id));
	archive_string_free(&(iso9660->utf16be));
	archive_string_free(&(iso9660->mbs));

	free(iso9660);
	a->format_data = NULL;

	return (ret);
}